

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O2

void cmCacheManager::OutputValue(ostream *fout,string *value)

{
  long lVar1;
  string truncated;
  
  lVar1 = std::__cxx11::string::find((char)value,10);
  if (lVar1 != -1) {
    std::__cxx11::string::substr((ulong)&truncated,(ulong)value);
    OutputValueNoNewlines(fout,&truncated);
    std::__cxx11::string::~string((string *)&truncated);
    return;
  }
  OutputValueNoNewlines(fout,value);
  return;
}

Assistant:

void cmCacheManager::OutputValue(std::ostream& fout, std::string const& value)
{
  // look for and truncate newlines
  std::string::size_type newline = value.find('\n');
  if (newline != std::string::npos) {
    std::string truncated = value.substr(0, newline);
    OutputValueNoNewlines(fout, truncated);
  } else {
    OutputValueNoNewlines(fout, value);
  }
}